

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall
ValueHashTable<ExprHash,_Value_*>::~ValueHashTable(ValueHashTable<ExprHash,_Value_*> *this)

{
  JitArenaAllocator *pJVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *this_00;
  long *plVar5;
  long extraout_RDX;
  code *local_70;
  uint local_44;
  uint i;
  ValueHashTable<ExprHash,_Value_*> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  for (local_44 = 0; local_44 < this->tableSize; local_44 = local_44 + 1) {
    this_00 = this->table + local_44;
    pJVar1 = this->alloc;
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
    next = *ppSVar4;
    while (bVar3 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   IsHead(this_00,next), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
      pSVar2 = *ppSVar4;
      local_70 = (code *)Memory::
                         TypeAllocatorFunc<Memory::ArenaAllocator,_HashBucket<ExprHash,_Value_*>_>::
                         GetFreeFunc();
      plVar5 = (long *)((long)&(pJVar1->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_Allocator.outOfMemoryFunc + extraout_RDX);
      if (((ulong)local_70 & 1) != 0) {
        local_70 = *(code **)(local_70 + *plVar5 + -1);
      }
      (*local_70)(plVar5,next,0x18);
      next = pSVar2;
    }
    SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Reset(this_00);
  }
  return;
}

Assistant:

~ValueHashTable()
    {
        for (uint i = 0; i< tableSize; i++)
        {
            table[i].Clear(alloc);
        }
    }